

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gls::BindHoleAttributeTest::iterate(BindHoleAttributeTest *this)

{
  int iVar1;
  deUint32 dVar2;
  int ndx;
  deInt32 local_1ac;
  undefined1 local_1a8 [40];
  BindHoleAttributeTest *local_180;
  string local_178;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  bindings;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  Attribute local_f8;
  AttribType vec4;
  string local_50;
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1ac = anon_unknown_1::getMaxAttributeLocations(this->m_renderCtx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"vec4",(allocator<char> *)local_1a8);
  std::__cxx11::string::string((string *)&vec4,(string *)&local_f8);
  vec4.m_locationSize = 1;
  vec4.m_glTypeEnum = 0x8b52;
  std::__cxx11::string::~string((string *)&local_f8);
  iVar1 = 1;
  if (this->m_arraySize != -1) {
    iVar1 = this->m_arraySize;
  }
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"a_0",(allocator<char> *)&local_50);
  AttributeLocationTestUtil::Cond::Cond((Cond *)local_1a8,COND_ALWAYS);
  AttributeLocationTestUtil::Attribute::Attribute
            (&local_f8,&vec4,&local_178,-1,(Cond *)local_1a8,-1);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_f8);
  AttributeLocationTestUtil::Attribute::~Attribute(&local_f8);
  std::__cxx11::string::~string((string *)(local_1a8 + 8));
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"a_0",(allocator<char> *)&local_178);
  std::__cxx11::string::string((string *)&local_f8,(string *)local_1a8);
  local_f8.m_type.m_locationSize = 0;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"a_1",(allocator<char> *)&local_50);
  AttributeLocationTestUtil::Cond::Cond((Cond *)local_1a8,COND_ALWAYS);
  AttributeLocationTestUtil::Attribute::Attribute
            (&local_f8,&this->m_type,&local_178,-1,(Cond *)local_1a8,this->m_arraySize);
  local_180 = this;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_f8);
  AttributeLocationTestUtil::Attribute::~Attribute(&local_f8);
  std::__cxx11::string::~string((string *)(local_1a8 + 8));
  std::__cxx11::string::~string((string *)&local_178);
  ndx = 2;
  dVar2 = iVar1 * (local_180->m_type).m_locationSize;
  while (dVar2 = dVar2 + 1, (int)dVar2 < local_1ac) {
    de::toString<int>(&local_50,&ndx);
    std::operator+(&local_178,"a_",&local_50);
    AttributeLocationTestUtil::Cond::Cond((Cond *)local_1a8,COND_ALWAYS);
    AttributeLocationTestUtil::Attribute::Attribute
              (&local_f8,&vec4,&local_178,-1,(Cond *)local_1a8,-1);
    std::
    vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
    ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_f8);
    AttributeLocationTestUtil::Attribute::~Attribute(&local_f8);
    std::__cxx11::string::~string((string *)(local_1a8 + 8));
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_50);
    de::toString<int>(&local_178,&ndx);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "a_",&local_178);
    std::__cxx11::string::string((string *)&local_f8,(string *)local_1a8);
    local_f8.m_type.m_locationSize = dVar2;
    std::
    vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
    ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::~string((string *)&local_178);
    ndx = ndx + 1;
  }
  local_f8.m_type.m_name._M_dataplus._M_p = (pointer)0x0;
  local_f8.m_type.m_name._M_string_length = 0;
  local_f8.m_type.m_name.field_2._M_allocated_capacity = 0;
  AttributeLocationTestUtil::runTest
            ((local_180->super_TestCase).super_TestNode.m_testCtx,local_180->m_renderCtx,&attributes
             ,&noBindings,&bindings,&noBindings,false,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)&local_f8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)&local_f8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&bindings);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  std::__cxx11::string::~string((string *)&vec4);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult BindHoleAttributeTest::iterate (void)
{
	const vector<Bind>	noBindings;
	const deInt32		maxAttributes = getMaxAttributeLocations(m_renderCtx);
	const AttribType	vec4("vec4", 1, GL_FLOAT_VEC4);
	const int			arrayElementCount	= (m_arraySize != Attribute::NOT_ARRAY ? m_arraySize : 1);

	vector<Attribute>	attributes;
	vector<Bind>		bindings;
	int					ndx;

	attributes.push_back(Attribute(vec4, "a_0"));
	bindings.push_back(Bind("a_0", 0));

	attributes.push_back(Attribute(m_type, "a_1", Attribute::LOC_UNDEF, Cond::COND_ALWAYS, m_arraySize));

	ndx = 2;
	for (int loc = 1 + m_type.getLocationSize() * arrayElementCount; loc < maxAttributes; loc++)
	{
		attributes.push_back(Attribute(vec4, "a_" + de::toString(ndx)));
		bindings.push_back(Bind("a_" + de::toString(ndx), loc));

		ndx++;
	}

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, bindings, noBindings, false);
	return STOP;
}